

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O3

void __thiscall SSD1306::OledPixel::setFrom(OledPixel *this,OledPixel *pixels,OledPoint offset)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong local_70;
  ulong local_68;
  
  uVar1 = (*this->_vptr_OledPixel[8])();
  iVar2 = (*pixels->_vptr_OledPixel[8])(pixels);
  uVar10 = offset.m_y;
  uVar7 = 0;
  if (uVar10 != 0 && -1 < (long)offset) {
    uVar7 = uVar10;
  }
  uVar3 = (*this->_vptr_OledPixel[9])(this);
  iVar4 = (*pixels->_vptr_OledPixel[9])(pixels);
  uVar5 = iVar4 + uVar10;
  if ((int)uVar3 <= (int)(iVar4 + uVar10)) {
    uVar5 = uVar3;
  }
  if ((int)uVar7 < (int)uVar5) {
    uVar3 = iVar2 + offset.m_x;
    if ((int)uVar1 <= (int)uVar3) {
      uVar3 = uVar1;
    }
    uVar6 = 0;
    if (0 < offset.m_x) {
      uVar6 = (ulong)offset & 0xffffffff;
    }
    local_70 = (ulong)uVar7;
    local_68 = local_70 << 0x20 | uVar6;
    do {
      if ((int)uVar6 < (int)uVar3) {
        uVar8 = local_68;
        lVar9 = uVar3 - uVar6;
        uVar11 = uVar6 - (long)offset;
        do {
          iVar2 = (*pixels->_vptr_OledPixel[4])
                            (pixels,uVar11 & 0xffffffff | (ulong)((int)local_70 - uVar10) << 0x20);
          (*this->_vptr_OledPixel[(ulong)(byte)((byte)iVar2 ^ 1) + 5])(this,uVar8);
          uVar11 = uVar11 + 1;
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      local_70 = local_70 + 1;
      local_68 = local_68 + 0x100000000;
    } while (local_70 != uVar5);
  }
  return;
}

Assistant:

void
SSD1306::OledPixel::setFrom(
    const OledPixel& pixels,
    SSD1306::OledPoint offset)
{
    auto xStart = std::max(0, offset.x());
    auto xEnd = std::min(width(), pixels.width() + offset.x());
    auto yStart = std::max(0, offset.y());
    auto yEnd = std::min(height(), pixels.height() + offset.y());

    for (auto y = yStart ; y < yEnd ; ++y)
    {
        for (auto x = xStart ; x < xEnd ; ++x)
        {
            OledPoint inputP{x - offset.x(), y - offset.y()};
            OledPoint outputP{x, y};

            if (pixels.isSetPixel(inputP))
            {
                setPixel(outputP);
            }
            else
            {
                unsetPixel(outputP);
            }
        }
    }
}